

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O1

void Fra_AddClausesSuper(Fra_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  void **ppvVar1;
  int iVar2;
  lit *begin;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                  ,0x85,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pNode->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                  ,0x86,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  uVar4 = vSuper->nSize;
  lVar7 = (long)(int)uVar4;
  begin = (lit *)malloc(lVar7 * 4 + 4);
  if (0 < lVar7) {
    lVar5 = 0;
    do {
      uVar3 = (ulong)vSuper->pArray[lVar5] & 0xfffffffffffffffe;
      *begin = ((uint)vSuper->pArray[lVar5] & 1) +
               *(int *)(*(long *)(*(long *)(uVar3 + 0x28) + 0x98) + (long)*(int *)(uVar3 + 0x24) * 4
                       ) * 2;
      begin[1] = *(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) * 2
                 + 1;
      iVar2 = sat_solver_addclause(p->pSat,begin,begin + 2);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                      ,0x91,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      lVar5 = lVar5 + 1;
      uVar4 = vSuper->nSize;
    } while (lVar5 < (int)uVar4);
  }
  if (0 < (int)uVar4) {
    ppvVar1 = vSuper->pArray;
    uVar3 = 0;
    do {
      uVar6 = (ulong)ppvVar1[uVar3] & 0xfffffffffffffffe;
      begin[uVar3] = ((uint)ppvVar1[uVar3] & 1) +
                     *(int *)(*(long *)(*(long *)(uVar6 + 0x28) + 0x98) +
                             (long)*(int *)(uVar6 + 0x24) * 4) * 2 ^ 1;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  begin[lVar7] = *(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) * 2;
  iVar2 = sat_solver_addclause(p->pSat,begin,begin + lVar7 + 1);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCnf.c"
                  ,0x98,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (begin == (lit *)0x0) {
    return;
  }
  free(begin);
  return;
}

Assistant:

void Fra_AddClausesSuper( Fra_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Fra_ObjSatNum(Aig_Regular(pFanin)), Aig_IsComplement(pFanin));
        pLits[1] = toLitCond(Fra_ObjSatNum(pNode), 1);
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        pLits[i] = toLitCond(Fra_ObjSatNum(Aig_Regular(pFanin)), !Aig_IsComplement(pFanin));
    pLits[nLits-1] = toLitCond(Fra_ObjSatNum(pNode), 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}